

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O0

wchar_t lzx_decode_blocks(lzx_stream *strm,wchar_t last)

{
  char cVar1;
  undefined1 uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int *piVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  wchar_t wVar18;
  undefined1 *puVar19;
  void *__src;
  lzx_stream *strm_00;
  int in_ESI;
  long in_RDI;
  wchar_t li;
  uchar *d;
  wchar_t l;
  uchar *s;
  wchar_t offbits;
  char block_type;
  wchar_t state;
  wchar_t r2;
  wchar_t r1;
  wchar_t r0;
  wchar_t position_slot;
  wchar_t offset_bits;
  wchar_t length_header;
  wchar_t w_size;
  wchar_t w_mask;
  wchar_t w_pos;
  wchar_t copy_pos;
  wchar_t copy_len;
  wchar_t c;
  wchar_t mt_max_bits;
  wchar_t lt_max_bits;
  wchar_t at_max_bits;
  size_t block_bytes_avail;
  uchar *mt_bitlen;
  uchar *lt_bitlen;
  uchar *at_bitlen;
  uchar *w_buff;
  uchar *endp;
  uchar *noutp;
  lzx_pos_tbl *pos_tbl;
  huffman *mt;
  huffman *lt;
  huffman *at;
  lzx_br bre;
  lzx_dec *ds;
  huffman *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  int local_ec;
  int local_dc;
  int local_c8;
  uint local_c4;
  uint local_c0;
  uint local_bc;
  int local_b8;
  int local_b4;
  uint local_b0;
  uint local_a4;
  uint local_a0;
  int local_9c;
  wchar_t local_98;
  ulong local_88;
  undefined1 *local_58;
  undefined8 local_28;
  
  piVar8 = *(int **)(in_RDI + 0x30);
  uVar9 = *(ulong *)(piVar8 + 0x1a);
  local_28 = *(undefined8 *)(piVar8 + 0x1c);
  lVar10 = *(long *)(piVar8 + 0x18);
  local_58 = *(undefined1 **)(in_RDI + 0x18);
  puVar19 = local_58 + *(long *)(in_RDI + 0x20);
  lVar11 = *(long *)(piVar8 + 4);
  lVar12 = *(long *)(piVar8 + 0x30);
  lVar13 = *(long *)(piVar8 + 0x4e);
  lVar14 = *(long *)(piVar8 + 0x6c);
  local_88 = *(ulong *)(piVar8 + 0xe);
  iVar3 = piVar8[0x32];
  iVar4 = piVar8[0x50];
  iVar5 = piVar8[0x6e];
  local_9c = piVar8[8];
  local_a0 = piVar8[7];
  local_a4 = piVar8[6];
  uVar6 = piVar8[2];
  iVar7 = piVar8[1];
  local_b0 = piVar8[0x15];
  local_b4 = piVar8[0x17];
  local_b8 = piVar8[0x16];
  local_bc = piVar8[0x10];
  local_c0 = piVar8[0x11];
  local_c4 = piVar8[0x12];
  local_c8 = *piVar8;
  cVar1 = *(char *)((long)piVar8 + 0x29);
switchD_00131f7b_default:
  uVar16 = local_c0;
  uVar15 = local_c4;
  strm_00 = (lzx_stream *)(ulong)(local_c8 - 0x12);
  switch(strm_00) {
  case (lzx_stream *)0x0:
    while( true ) {
      if (local_88 == 0) {
        *piVar8 = 2;
        *(ulong *)(piVar8 + 0x1a) = uVar9;
        *(undefined8 *)(piVar8 + 0x1c) = local_28;
        piVar8[0xe] = 0;
        piVar8[0xf] = 0;
        piVar8[8] = local_9c;
        piVar8[7] = local_a0;
        piVar8[0x15] = local_b0;
        piVar8[0x16] = local_b8;
        piVar8[0x10] = local_bc;
        piVar8[0x11] = local_c0;
        piVar8[0x12] = local_c4;
        piVar8[6] = local_a4;
        *(long *)(in_RDI + 0x20) = (long)puVar19 - (long)local_58;
        return L'\x01';
      }
      if (puVar19 <= local_58) goto LAB_00132902;
      if ((((int)local_28 < iVar5) &&
          (wVar18 = lzx_br_fillup(strm_00,(lzx_br *)
                                          CONCAT44(in_stack_ffffffffffffff04,
                                                   in_stack_ffffffffffffff00)), wVar18 == L'\0')) &&
         ((int)local_28 < iVar5)) {
        if (in_ESI == 0) goto LAB_00132902;
        local_98 = lzx_decode_huffman(in_stack_fffffffffffffef8,0);
        local_28._0_4_ = (int)local_28 - (uint)*(byte *)(lVar14 + local_98);
        if ((int)local_28 < 0) goto LAB_001328e0;
      }
      else {
        local_98 = lzx_decode_huffman(in_stack_fffffffffffffef8,0);
        local_28._0_4_ = (int)local_28 - (uint)*(byte *)(lVar14 + local_98);
      }
      if (L'ÿ' < local_98) break;
      *(char *)(lVar11 + (int)local_a4) = (char)local_98;
      local_a4 = local_a4 + 1 & uVar6;
      *local_58 = (char)local_98;
      local_88 = local_88 - 1;
      local_58 = local_58 + 1;
    }
    local_b0 = local_98 + L'\xffffff00' & 7;
    local_b8 = local_98 + L'\xffffff00' >> 3;
    break;
  case (lzx_stream *)0x2:
    goto switchD_00131f7b_caseD_2;
  case (lzx_stream *)0x3:
    goto switchD_00131f7b_caseD_3;
  case (lzx_stream *)0x4:
    goto switchD_00131f7b_caseD_4;
  default:
    goto switchD_00131f7b_default;
  }
  if (local_b0 == 7) {
    if ((((int)local_28 < iVar4) &&
        (wVar18 = lzx_br_fillup(strm_00,(lzx_br *)
                                        CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00
                                                )), wVar18 == L'\0')) && ((int)local_28 < iVar4)) {
      if (in_ESI == 0) {
        local_c8 = 0x13;
        goto LAB_00132902;
      }
      local_98 = lzx_decode_huffman(in_stack_fffffffffffffef8,0);
      local_28._0_4_ = (int)local_28 - (uint)*(byte *)(lVar13 + local_98);
      if ((int)local_28 < 0) goto LAB_001328e0;
    }
    else {
      local_98 = lzx_decode_huffman(in_stack_fffffffffffffef8,0);
      local_28._0_4_ = (int)local_28 - (uint)*(byte *)(lVar13 + local_98);
    }
    local_9c = local_98 + L'\t';
  }
  else {
    local_9c = local_b0 + 2;
  }
  if (local_88 < (ulong)(long)local_9c) goto LAB_001328e0;
  in_stack_ffffffffffffff04 = local_b8;
  if (local_b8 == 0) {
    local_a0 = local_bc;
    local_c8 = 0x15;
  }
  else {
    if (local_b8 != 1) {
      if (local_b8 == 2) {
        local_a0 = local_c4;
        local_c4 = local_bc;
        local_bc = uVar15;
        local_c8 = 0x15;
        goto switchD_00131f7b_default;
      }
      local_b4 = *(int *)(lVar10 + 4 + (long)local_b8 * 8);
switchD_00131f7b_caseD_2:
      if ((cVar1 == '\x02') && (2 < local_b4)) {
        iVar17 = local_b4 + -3;
        if (((iVar17 <= (int)local_28) ||
            (wVar18 = lzx_br_fillup(strm_00,(lzx_br *)
                                            CONCAT44(in_stack_ffffffffffffff04,
                                                     in_stack_ffffffffffffff00)), wVar18 != L'\0'))
           || (iVar17 <= (int)local_28)) {
          local_a0 = ((uint)(uVar9 >> ((char)local_28 - (char)iVar17 & 0x3fU)) & cache_masks[iVar17]
                     ) * 8;
          if ((((int)local_28 < iVar17 + iVar3) &&
              (wVar18 = lzx_br_fillup(strm_00,(lzx_br *)
                                              CONCAT44(in_stack_ffffffffffffff04,
                                                       in_stack_ffffffffffffff00)), wVar18 == L'\0')
              ) && ((int)local_28 < iVar17 + iVar3)) {
            if (in_ESI == 0) {
              local_c8 = 0x14;
              goto LAB_00132902;
            }
            local_98 = lzx_decode_huffman(in_stack_fffffffffffffef8,0);
            local_28._0_4_ = ((int)local_28 - iVar17) - (uint)*(byte *)(lVar12 + local_98);
            if ((int)local_28 < 0) goto LAB_001328e0;
          }
          else {
            local_98 = lzx_decode_huffman(in_stack_fffffffffffffef8,0);
            local_28._0_4_ = ((int)local_28 - iVar17) - (uint)*(byte *)(lVar12 + local_98);
          }
          local_a0 = local_98 + local_a0;
LAB_001326b2:
          local_a0 = *(int *)(lVar10 + (long)local_b8 * 8) + -2 + local_a0;
          local_c4 = local_c0;
          local_c0 = local_bc;
          local_bc = local_a0;
switchD_00131f7b_caseD_3:
          local_a0 = local_a4 - local_a0 & uVar6;
switchD_00131f7b_caseD_4:
          while( true ) {
            local_dc = local_9c;
            if ((int)local_a4 < (int)local_a0) {
              if ((int)(iVar7 - local_a0) < local_9c) {
                local_dc = iVar7 - local_a0;
              }
            }
            else if ((int)(iVar7 - local_a4) < local_9c) {
              local_dc = iVar7 - local_a4;
            }
            if (puVar19 <= local_58 + local_dc) {
              local_dc = (int)puVar19 - (int)local_58;
            }
            __src = (void *)(lVar11 + (int)local_a0);
            if ((local_dc < 8) ||
               (((int)local_a4 <= (int)(local_a0 + local_dc) &&
                ((int)local_a0 <= (int)(local_a4 + local_dc))))) {
              for (local_ec = 0; local_ec < local_dc; local_ec = local_ec + 1) {
                uVar2 = *(undefined1 *)((long)__src + (long)local_ec);
                *(undefined1 *)(lVar11 + (int)local_a4 + (long)local_ec) = uVar2;
                local_58[local_ec] = uVar2;
              }
            }
            else {
              memcpy((void *)(lVar11 + (int)local_a4),__src,(long)local_dc);
              memcpy(local_58,__src,(long)local_dc);
            }
            local_58 = local_58 + local_dc;
            local_a0 = local_a0 + local_dc & uVar6;
            local_a4 = local_a4 + local_dc & uVar6;
            local_88 = local_88 - (long)local_dc;
            if (local_9c <= local_dc) break;
            local_9c = local_9c - local_dc;
            if (puVar19 <= local_58) {
              local_c8 = 0x16;
              goto LAB_00132902;
            }
          }
          local_c8 = 0x12;
          goto switchD_00131f7b_default;
        }
      }
      else if ((local_b4 <= (int)local_28) ||
              ((wVar18 = lzx_br_fillup(strm_00,(lzx_br *)
                                               CONCAT44(in_stack_ffffffffffffff04,
                                                        in_stack_ffffffffffffff00)), wVar18 != L'\0'
               || (local_b4 <= (int)local_28)))) {
        local_a0 = (uint)(uVar9 >> ((char)local_28 - (char)local_b4 & 0x3fU)) &
                   cache_masks[local_b4];
        local_28._0_4_ = (int)local_28 - local_b4;
        goto LAB_001326b2;
      }
      local_c8 = 0x14;
      if (in_ESI == 0) {
LAB_00132902:
        *(ulong *)(piVar8 + 0x1a) = uVar9;
        *(undefined8 *)(piVar8 + 0x1c) = local_28;
        *(ulong *)(piVar8 + 0xe) = local_88;
        piVar8[8] = local_9c;
        piVar8[7] = local_a0;
        piVar8[0x15] = local_b0;
        piVar8[0x17] = local_b4;
        piVar8[0x16] = local_b8;
        piVar8[0x10] = local_bc;
        piVar8[0x11] = local_c0;
        piVar8[0x12] = local_c4;
        *piVar8 = local_c8;
        piVar8[6] = local_a4;
        *(long *)(in_RDI + 0x20) = (long)puVar19 - (long)local_58;
        return L'\0';
      }
LAB_001328e0:
      piVar8[0x97] = -0x19;
      return L'\xffffffe7';
    }
    local_a0 = local_c0;
    local_c0 = local_bc;
    local_bc = uVar16;
    local_c8 = 0x15;
  }
  goto switchD_00131f7b_default;
}

Assistant:

static int
lzx_decode_blocks(struct lzx_stream *strm, int last)
{
	struct lzx_dec *ds = strm->ds;
	struct lzx_br bre = ds->br;
	struct huffman *at = &(ds->at), *lt = &(ds->lt), *mt = &(ds->mt);
	const struct lzx_pos_tbl *pos_tbl = ds->pos_tbl;
	unsigned char *noutp = strm->next_out;
	unsigned char *endp = noutp + strm->avail_out;
	unsigned char *w_buff = ds->w_buff;
	unsigned char *at_bitlen = at->bitlen;
	unsigned char *lt_bitlen = lt->bitlen;
	unsigned char *mt_bitlen = mt->bitlen;
	size_t block_bytes_avail = ds->block_bytes_avail;
	int at_max_bits = at->max_bits;
	int lt_max_bits = lt->max_bits;
	int mt_max_bits = mt->max_bits;
	int c, copy_len = ds->copy_len, copy_pos = ds->copy_pos;
	int w_pos = ds->w_pos, w_mask = ds->w_mask, w_size = ds->w_size;
	int length_header = ds->length_header;
	int offset_bits = ds->offset_bits;
	int position_slot = ds->position_slot;
	int r0 = ds->r0, r1 = ds->r1, r2 = ds->r2;
	int state = ds->state;
	char block_type = ds->block_type;

	for (;;) {
		switch (state) {
		case ST_MAIN:
			for (;;) {
				if (block_bytes_avail == 0) {
					/* This block ended. */
					ds->state = ST_RD_BLOCK_TYPE;
					ds->br = bre;
					ds->block_bytes_avail =
					    block_bytes_avail;
					ds->copy_len = copy_len;
					ds->copy_pos = copy_pos;
					ds->length_header = length_header;
					ds->position_slot = position_slot;
					ds->r0 = r0; ds->r1 = r1; ds->r2 = r2;
					ds->w_pos = w_pos;
					strm->avail_out = endp - noutp;
					return (ARCHIVE_EOF);
				}
				if (noutp >= endp)
					/* Output buffer is empty. */
					goto next_data;

				if (!lzx_br_read_ahead(strm, &bre,
				    mt_max_bits)) {
					if (!last)
						goto next_data;
					/* Remaining bits are less than
					 * maximum bits(mt.max_bits) but maybe
					 * it still remains as much as we need,
					 * so we should try to use it with
					 * dummy bits. */
					c = lzx_decode_huffman(mt,
					      lzx_br_bits_forced(
				 	        &bre, mt_max_bits));
					lzx_br_consume(&bre, mt_bitlen[c]);
					if (!lzx_br_has(&bre, 0))
						goto failed;/* Over read. */
				} else {
					c = lzx_decode_huffman(mt,
					      lzx_br_bits(&bre, mt_max_bits));
					lzx_br_consume(&bre, mt_bitlen[c]);
				}
				if (c > UCHAR_MAX)
					break;
				/*
				 * 'c' is exactly literal code.
				 */
				/* Save a decoded code to reference it
				 * afterward. */
				w_buff[w_pos] = c;
				w_pos = (w_pos + 1) & w_mask;
				/* Store the decoded code to output buffer. */
				*noutp++ = c;
				block_bytes_avail--;
			}
			/*
			 * Get a match code, its length and offset.
			 */
			c -= UCHAR_MAX + 1;
			length_header = c & 7;
			position_slot = c >> 3;
			/* FALL THROUGH */
		case ST_LENGTH:
			/*
			 * Get a length.
			 */
			if (length_header == 7) {
				if (!lzx_br_read_ahead(strm, &bre,
				    lt_max_bits)) {
					if (!last) {
						state = ST_LENGTH;
						goto next_data;
					}
					c = lzx_decode_huffman(lt,
					      lzx_br_bits_forced(
					        &bre, lt_max_bits));
					lzx_br_consume(&bre, lt_bitlen[c]);
					if (!lzx_br_has(&bre, 0))
						goto failed;/* Over read. */
				} else {
					c = lzx_decode_huffman(lt,
					    lzx_br_bits(&bre, lt_max_bits));
					lzx_br_consume(&bre, lt_bitlen[c]);
				}
				copy_len = c + 7 + 2;
			} else
				copy_len = length_header + 2;
			if ((size_t)copy_len > block_bytes_avail)
				goto failed;
			/*
			 * Get an offset.
			 */
			switch (position_slot) {
			case 0: /* Use repeated offset 0. */
				copy_pos = r0;
				state = ST_REAL_POS;
				continue;
			case 1: /* Use repeated offset 1. */
				copy_pos = r1;
				/* Swap repeated offset. */
				r1 = r0;
				r0 = copy_pos;
				state = ST_REAL_POS;
				continue;
			case 2: /* Use repeated offset 2. */
				copy_pos = r2;
				/* Swap repeated offset. */
				r2 = r0;
				r0 = copy_pos;
				state = ST_REAL_POS;
				continue;
			default:
				offset_bits =
				    pos_tbl[position_slot].footer_bits;
				break;
			}
			/* FALL THROUGH */
		case ST_OFFSET:
			/*
			 * Get the offset, which is a distance from
			 * current window position.
			 */
			if (block_type == ALIGNED_OFFSET_BLOCK &&
			    offset_bits >= 3) {
				int offbits = offset_bits - 3;

				if (!lzx_br_read_ahead(strm, &bre, offbits)) {
					state = ST_OFFSET;
					if (last)
						goto failed;
					goto next_data;
				}
				copy_pos = lzx_br_bits(&bre, offbits) << 3;

				/* Get an aligned number. */
				if (!lzx_br_read_ahead(strm, &bre,
				    offbits + at_max_bits)) {
					if (!last) {
						state = ST_OFFSET;
						goto next_data;
					}
					lzx_br_consume(&bre, offbits);
					c = lzx_decode_huffman(at,
					      lzx_br_bits_forced(&bre,
					        at_max_bits));
					lzx_br_consume(&bre, at_bitlen[c]);
					if (!lzx_br_has(&bre, 0))
						goto failed;/* Over read. */
				} else {
					lzx_br_consume(&bre, offbits);
					c = lzx_decode_huffman(at,
					      lzx_br_bits(&bre, at_max_bits));
					lzx_br_consume(&bre, at_bitlen[c]);
				}
				/* Add an aligned number. */
				copy_pos += c;
			} else {
				if (!lzx_br_read_ahead(strm, &bre,
				    offset_bits)) {
					state = ST_OFFSET;
					if (last)
						goto failed;
					goto next_data;
				}
				copy_pos = lzx_br_bits(&bre, offset_bits);
				lzx_br_consume(&bre, offset_bits);
			}
			copy_pos += pos_tbl[position_slot].base -2;

			/* Update repeated offset LRU queue. */
			r2 = r1;
			r1 = r0;
			r0 = copy_pos;
			/* FALL THROUGH */
		case ST_REAL_POS:
			/*
			 * Compute a real position in window.
			 */
			copy_pos = (w_pos - copy_pos) & w_mask;
			/* FALL THROUGH */
		case ST_COPY:
			/*
			 * Copy several bytes as extracted data from the window
			 * into the output buffer.
			 */
			for (;;) {
				const unsigned char *s;
				int l;

				l = copy_len;
				if (copy_pos > w_pos) {
					if (l > w_size - copy_pos)
						l = w_size - copy_pos;
				} else {
					if (l > w_size - w_pos)
						l = w_size - w_pos;
				}
				if (noutp + l >= endp)
					l = (int)(endp - noutp);
				s = w_buff + copy_pos;
				if (l >= 8 && ((copy_pos + l < w_pos)
				  || (w_pos + l < copy_pos))) {
					memcpy(w_buff + w_pos, s, l);
					memcpy(noutp, s, l);
				} else {
					unsigned char *d;
					int li;

					d = w_buff + w_pos;
					for (li = 0; li < l; li++)
						noutp[li] = d[li] = s[li];
				}
				noutp += l;
				copy_pos = (copy_pos + l) & w_mask;
				w_pos = (w_pos + l) & w_mask;
				block_bytes_avail -= l;
				if (copy_len <= l)
					/* A copy of current pattern ended. */
					break;
				copy_len -= l;
				if (noutp >= endp) {
					/* Output buffer is empty. */
					state = ST_COPY;
					goto next_data;
				}
			}
			state = ST_MAIN;
			break;
		}
	}
failed:
	return (ds->error = ARCHIVE_FAILED);
next_data:
	ds->br = bre;
	ds->block_bytes_avail = block_bytes_avail;
	ds->copy_len = copy_len;
	ds->copy_pos = copy_pos;
	ds->length_header = length_header;
	ds->offset_bits = offset_bits;
	ds->position_slot = position_slot;
	ds->r0 = r0; ds->r1 = r1; ds->r2 = r2;
	ds->state = state;
	ds->w_pos = w_pos;
	strm->avail_out = endp - noutp;
	return (ARCHIVE_OK);
}